

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O2

void __thiscall
test::test_generate_export_import_and_sign::test_method(test_generate_export_import_and_sign *this)

{
  long *local_c0;
  allocator local_b8 [8];
  undefined8 local_b0;
  shared_count sStack_a8;
  undefined **local_a0;
  undefined1 local_98;
  undefined1 *local_90;
  char *local_88;
  string signature;
  string pk;
  char *local_20;
  char *local_18;
  
  license::CryptoHelper::getInstance();
  (**(code **)*local_c0)();
  (**(code **)(*local_c0 + 8))(&pk);
  (**(code **)(*local_c0 + 0x20))(local_c0,&pk);
  std::__cxx11::string::string((string *)&local_a0,"testString",local_b8);
  (**(code **)(*local_c0 + 0x28))(&signature,local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  local_20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
  ;
  local_18 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_20,0x71);
  local_b8[0] = (allocator)(signature._M_string_length == 0xac);
  local_b0 = 0;
  sStack_a8.pi_ = (sp_counted_base *)0x0;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_00541db0;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = "signature is the right size";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_a8);
  std::__cxx11::string::~string((string *)&signature);
  std::__cxx11::string::~string((string *)&pk);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_generate_export_import_and_sign) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	crypto->generateKeyPair();
	const string pk = crypto->exportPrivateKey();
	crypto->loadPrivateKey(pk);
	const string signature = crypto->signString("testString");
	//(1024/8)*(4/3)+4 (base64)
	BOOST_CHECK_MESSAGE(signature.size() == 172, "signature is the right size");
	crypto.release();
}